

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeMovetoUnpacked
              (BtCursor *pCur,UnpackedRecord *pIdxKey,i64 intKey,int biasRight,int *pRes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  KeyInfo *pKVar6;
  MemPage *pMVar7;
  long lVar8;
  int iVar9;
  uchar *pBuf;
  byte *pbVar10;
  ulong uVar11;
  uint uVar12;
  char cVar13;
  uint uVar14;
  u8 *puVar15;
  int *piVar16;
  uint uVar17;
  u32 amt;
  bool bVar18;
  i64 nCellKey;
  int local_8c;
  code *local_78;
  int local_70;
  uint local_6c;
  u64 local_38;
  
  piVar16 = pRes;
  if (pIdxKey == (UnpackedRecord *)0x0) {
    if ((pCur->eState == '\x01') && ((pCur->curFlags & 2) != 0)) {
      lVar8 = (pCur->info).nKey;
      if (lVar8 == intKey) {
        *pRes = 0;
        return 0;
      }
      if (lVar8 < intKey) {
        if ((pCur->curFlags & 8) != 0) goto LAB_002165e4;
        if ((lVar8 + 1 == intKey) && (pCur->skipNext == 0)) {
          *pRes = 0;
          iVar9 = sqlite3BtreeNext(pCur,0);
          if (iVar9 != 0x65) {
            if (iVar9 != 0) {
              return iVar9;
            }
            getCellInfo(pCur);
            if ((pCur->info).nKey == intKey) {
              return 0;
            }
          }
        }
      }
    }
    local_78 = (code *)0x0;
  }
  else {
    pKVar6 = pIdxKey->pKeyInfo;
    if ((uint)pKVar6->nXField + (uint)pKVar6->nField < 0xe) {
      uVar5 = pIdxKey->aMem->flags;
      bVar18 = *pKVar6->aSortOrder == '\0';
      pIdxKey->r1 = -bVar18 | 1;
      pIdxKey->r2 = -!bVar18 | 1;
      if ((uVar5 & 4) == 0) {
        if (((uVar5 & 0x19) == 0) && (pKVar6->aColl[0] == (CollSeq *)0x0)) {
          local_78 = vdbeRecordCompareString;
          goto LAB_00216098;
        }
        bVar18 = true;
      }
      else {
        local_78 = vdbeRecordCompareInt;
LAB_00216098:
        bVar18 = false;
      }
      if (bVar18) goto LAB_002160a3;
    }
    else {
LAB_002160a3:
      local_78 = sqlite3VdbeRecordCompare;
    }
    pIdxKey->errCode = '\0';
  }
  iVar9 = moveToRoot(pCur);
  if (iVar9 != 0) {
    return iVar9;
  }
  if (pCur->eState != '\0') {
    local_8c = 0;
    do {
      pMVar7 = pCur->apPage[pCur->iPage];
      iVar9 = pMVar7->nCell - 1;
      uVar12 = iVar9 >> (1U - (char)biasRight & 0x1f);
      pCur->ix = (u16)uVar12;
      if (local_78 == (code *)0x0) {
        uVar17 = 0;
        do {
          puVar15 = pMVar7->aDataOfst +
                    (CONCAT11(pMVar7->aCellIdx[(long)(int)uVar12 * 2],
                              pMVar7->aCellIdx[(long)(int)uVar12 * 2 + 1]) & pMVar7->maskPage);
          if (pMVar7->intKeyLeaf == '\0') {
LAB_002163c5:
            piVar16 = (int *)((ulong)piVar16 & 0xffffffff);
            sqlite3GetVarint(puVar15,&local_38);
            if ((long)local_38 < intKey) {
              uVar17 = uVar12 + 1;
              if ((int)uVar12 < iVar9) {
LAB_002163ff:
                uVar12 = (int)(iVar9 + uVar17) >> 1;
                cVar13 = '\0';
              }
              else {
                piVar16 = (int *)0xffffffff;
                cVar13 = '\x04';
              }
            }
            else if (intKey < (long)local_38) {
              iVar9 = uVar12 - 1;
              if ((int)uVar17 < (int)uVar12) goto LAB_002163ff;
              piVar16 = (int *)0x1;
              cVar13 = '\x04';
            }
            else {
              pCur->ix = (u16)uVar12;
              if (pMVar7->leaf == '\0') {
                cVar13 = '\b';
                uVar17 = uVar12;
              }
              else {
                pCur->curFlags = pCur->curFlags | 2;
                (pCur->info).nKey = local_38;
                (pCur->info).nSize = 0;
                *pRes = 0;
                local_70 = 0;
                cVar13 = '\x01';
              }
            }
          }
          else {
            do {
              if (-1 < (char)*puVar15) {
                puVar15 = puVar15 + 1;
                goto LAB_002163c5;
              }
              puVar15 = puVar15 + 1;
            } while (puVar15 < pMVar7->aDataEnd);
            local_70 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfd37,
                        "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
            piVar16 = (int *)((ulong)piVar16 & 0xffffffff);
            cVar13 = '\x01';
          }
        } while (cVar13 == '\0');
        if (cVar13 == '\x04') goto LAB_00216488;
        if (cVar13 != '\b') goto LAB_00216536;
LAB_002164b3:
        if ((int)uVar17 < (int)(uint)pMVar7->nCell) {
          lVar8 = (ulong)(CONCAT11(pMVar7->aCellIdx[(long)(int)uVar17 * 2],
                                   pMVar7->aCellIdx[(long)(int)uVar17 * 2 + 1]) & pMVar7->maskPage)
                  + 3;
        }
        else {
          lVar8 = (ulong)pMVar7->hdrOffset + 0xb;
        }
        pbVar10 = pMVar7->aData + lVar8;
        bVar1 = pbVar10[-3];
        bVar2 = pbVar10[-2];
        bVar3 = pbVar10[-1];
        bVar4 = *pbVar10;
        pCur->ix = (u16)uVar17;
        local_8c = moveToChild(pCur,(uint)bVar4 |
                                    (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18);
        cVar13 = (local_8c != 0) * '\x02';
      }
      else {
        uVar17 = 0;
        do {
          puVar15 = pMVar7->aDataOfst;
          uVar11 = (ulong)(CONCAT11(pMVar7->aCellIdx[(long)(int)uVar12 * 2],
                                    pMVar7->aCellIdx[(long)(int)uVar12 * 2 + 1]) & pMVar7->maskPage)
          ;
          pbVar10 = puVar15 + uVar11;
          bVar1 = *pbVar10;
          if (pMVar7->max1bytePayload < bVar1) {
            bVar2 = pbVar10[1];
            if ((-1 < (char)bVar2) &&
               (uVar14 = (bVar1 & 0x7f) << 7 | (int)(char)bVar2, uVar14 <= pMVar7->maxLocal)) {
              uVar14 = (*local_78)(uVar14,puVar15 + uVar11 + 2,pIdxKey);
              piVar16 = (int *)(ulong)uVar14;
              goto LAB_002162c6;
            }
            local_6c = (uint)piVar16;
            (*pMVar7->xParseCell)(pMVar7,puVar15 + (uVar11 - pMVar7->childPtrSize),&pCur->info);
            uVar11 = (pCur->info).nKey;
            amt = (u32)uVar11;
            if ((int)amt < 2) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfd81,
                          "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
              local_8c = 0xb;
LAB_00216280:
              bVar18 = false;
              cVar13 = '\v';
            }
            else {
              pBuf = (uchar *)sqlite3Malloc((ulong)(amt + 0x12));
              cVar13 = '\v';
              if (pBuf == (uchar *)0x0) {
                local_8c = 7;
                goto LAB_00216280;
              }
              pCur->ix = (u16)uVar12;
              local_8c = accessPayload(pCur,0,amt,pBuf,0);
              pCur->curFlags = pCur->curFlags & 0xfb;
              bVar18 = local_8c == 0;
              if (bVar18) {
                local_6c = (*local_78)(uVar11 & 0xffffffff,pBuf,pIdxKey);
                sqlite3_free(pBuf);
                cVar13 = '\0';
                local_8c = 0;
              }
              else {
                sqlite3_free(pBuf);
              }
            }
            piVar16 = (int *)(ulong)local_6c;
            if (bVar18) goto LAB_002162c6;
          }
          else {
            uVar14 = (*local_78)(bVar1,pbVar10 + 1,pIdxKey);
            piVar16 = (int *)(ulong)uVar14;
LAB_002162c6:
            if ((int)piVar16 < 0) {
              uVar17 = uVar12 + 1;
            }
            else {
              if ((int)piVar16 == 0) {
                piVar16 = (int *)0x0;
                *pRes = 0;
                pCur->ix = (u16)uVar12;
                cVar13 = '\v';
                local_8c = 0xb;
                if (pIdxKey->errCode == '\0') {
                  local_8c = 0;
                }
                goto LAB_00216316;
              }
              iVar9 = uVar12 - 1;
            }
            cVar13 = '\t';
            if ((int)uVar17 <= iVar9) {
              uVar12 = iVar9 + uVar17 >> 1;
              cVar13 = '\0';
            }
          }
LAB_00216316:
        } while (cVar13 == '\0');
        if (cVar13 == '\t') {
LAB_00216488:
          if (pMVar7->leaf == '\0') goto LAB_002164b3;
          pCur->ix = (u16)uVar12;
          *pRes = (int)piVar16;
          local_8c = 0;
          cVar13 = '\v';
        }
      }
LAB_00216536:
      if (cVar13 != '\0') {
        if ((cVar13 != '\v') && (cVar13 != '\x02')) {
          return local_70;
        }
        (pCur->info).nSize = 0;
        return local_8c;
      }
    } while( true );
  }
LAB_002165e4:
  *pRes = -1;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeMovetoUnpacked(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( (pIdxKey==0)==(pCur->pKeyInfo==0) );
  assert( pCur->eState!=CURSOR_VALID || (pIdxKey==0)==(pCur->curIntKey!=0) );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pIdxKey==0
   && pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0
  ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowely */
      if( pCur->info.nKey+1==intKey && !pCur->skipNext ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc==SQLITE_DONE ){
          rc = SQLITE_OK;
        }else{
          return rc;
        }
      }
    }
  }

  if( pIdxKey ){
    xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
    pIdxKey->errCode = 0;
    assert( pIdxKey->default_rc==1 
         || pIdxKey->default_rc==0 
         || pIdxKey->default_rc==-1
    );
  }else{
    xRecordCompare = 0; /* All keys are integers */
  }

  rc = moveToRoot(pCur);
  if( rc ){
    return rc;
  }
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage] );
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->isInit );
  assert( pCur->eState==CURSOR_INVALID || pCur->apPage[pCur->iPage]->nCell>0 );
  if( pCur->eState==CURSOR_INVALID ){
    *pRes = -1;
    assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->nCell==0 );
    return SQLITE_OK;
  }
  assert( pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey || pIdxKey );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->apPage[pCur->iPage];
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==(pIdxKey==0) );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    pCur->ix = (u16)idx;
    if( xRecordCompare==0 ){
      for(;;){
        i64 nCellKey;
        pCell = findCellPastPtr(pPage, idx);
        if( pPage->intKeyLeaf ){
          while( 0x80 <= *(pCell++) ){
            if( pCell>=pPage->aDataEnd ){
              return SQLITE_CORRUPT_PGNO(pPage->pgno);
            }
          }
        }
        getVarint(pCell, (u64*)&nCellKey);
        if( nCellKey<intKey ){
          lwr = idx+1;
          if( lwr>upr ){ c = -1; break; }
        }else if( nCellKey>intKey ){
          upr = idx-1;
          if( lwr>upr ){ c = +1; break; }
        }else{
          assert( nCellKey==intKey );
          pCur->ix = (u16)idx;
          if( !pPage->leaf ){
            lwr = idx;
            goto moveto_next_layer;
          }else{
            pCur->curFlags |= BTCF_ValidNKey;
            pCur->info.nKey = nCellKey;
            pCur->info.nSize = 0;
            *pRes = 0;
            return SQLITE_OK;
          }
        }
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
      }
    }else{
      for(;;){
        int nCell;  /* Size of the pCell cell in bytes */
        pCell = findCellPastPtr(pPage, idx);

        /* The maximum supported page-size is 65536 bytes. This means that
        ** the maximum number of record bytes stored on an index B-Tree
        ** page is less than 16384 bytes and may be stored as a 2-byte
        ** varint. This information is used to attempt to avoid parsing 
        ** the entire cell by checking for the cases where the record is 
        ** stored entirely within the b-tree page by inspecting the first 
        ** 2 bytes of the cell.
        */
        nCell = pCell[0];
        if( nCell<=pPage->max1bytePayload ){
          /* This branch runs if the record-size field of the cell is a
          ** single byte varint and the record fits entirely on the main
          ** b-tree page.  */
          testcase( pCell+nCell+1==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
        }else if( !(pCell[1] & 0x80) 
          && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
        ){
          /* The record-size field is a 2 byte varint and the record 
          ** fits entirely on the main b-tree page.  */
          testcase( pCell+nCell+2==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
        }else{
          /* The record flows over onto one or more overflow pages. In
          ** this case the whole cell needs to be parsed, a buffer allocated
          ** and accessPayload() used to retrieve the record into the
          ** buffer before VdbeRecordCompare() can be called. 
          **
          ** If the record is corrupt, the xRecordCompare routine may read
          ** up to two varints past the end of the buffer. An extra 18 
          ** bytes of padding is allocated at the end of the buffer in
          ** case this happens.  */
          void *pCellKey;
          u8 * const pCellBody = pCell - pPage->childPtrSize;
          pPage->xParseCell(pPage, pCellBody, &pCur->info);
          nCell = (int)pCur->info.nKey;
          testcase( nCell<0 );   /* True if key size is 2^32 or more */
          testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
          testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
          testcase( nCell==2 );  /* Minimum legal index key size */
          if( nCell<2 ){
            rc = SQLITE_CORRUPT_PGNO(pPage->pgno);
            goto moveto_finish;
          }
          pCellKey = sqlite3Malloc( nCell+18 );
          if( pCellKey==0 ){
            rc = SQLITE_NOMEM_BKPT;
            goto moveto_finish;
          }
          pCur->ix = (u16)idx;
          rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
          pCur->curFlags &= ~BTCF_ValidOvfl;
          if( rc ){
            sqlite3_free(pCellKey);
            goto moveto_finish;
          }
          c = xRecordCompare(nCell, pCellKey, pIdxKey);
          sqlite3_free(pCellKey);
        }
        assert( 
            (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
         && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
        );
        if( c<0 ){
          lwr = idx+1;
        }else if( c>0 ){
          upr = idx-1;
        }else{
          assert( c==0 );
          *pRes = 0;
          rc = SQLITE_OK;
          pCur->ix = (u16)idx;
          if( pIdxKey->errCode ) rc = SQLITE_CORRUPT;
          goto moveto_finish;
        }
        if( lwr>upr ) break;
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
      }
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->apPage[pCur->iPage]->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_finish;
    }
moveto_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}